

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Slow(CodedInputStream *this,uint64_t *value)

{
  byte bVar1;
  bool bVar2;
  int local_2c;
  uint32_t b;
  int count;
  uint64_t result;
  uint64_t *value_local;
  CodedInputStream *this_local;
  
  _b = 0;
  local_2c = 0;
  do {
    if (local_2c == 10) {
      *value = 0;
      return false;
    }
    while (this->buffer_ == this->buffer_end_) {
      bVar2 = Refresh(this);
      if (!bVar2) {
        *value = 0;
        return false;
      }
    }
    bVar1 = *this->buffer_;
    _b = (ulong)(bVar1 & 0x7f) << ((char)local_2c * '\a' & 0x3fU) | _b;
    Advance(this,1);
    local_2c = local_2c + 1;
  } while ((bVar1 & 0x80) != 0);
  *value = _b;
  return true;
}

Assistant:

bool CodedInputStream::ReadVarint64Slow(uint64_t* value) {
  // Slow path:  This read might cross the end of the buffer, so we
  // need to check and refresh the buffer if and when it does.

  uint64_t result = 0;
  int count = 0;
  uint32_t b;

  do {
    if (count == kMaxVarintBytes) {
      *value = 0;
      return false;
    }
    while (buffer_ == buffer_end_) {
      if (!Refresh()) {
        *value = 0;
        return false;
      }
    }
    b = *buffer_;
    result |= static_cast<uint64_t>(b & 0x7F) << (7 * count);
    Advance(1);
    ++count;
  } while (b & 0x80);

  *value = result;
  return true;
}